

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O0

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint file_index)

{
  uint uVar1;
  mz_zip_internal_state *pArray;
  mz_uint64 cur_file_ofs;
  ulong min_new_capacity;
  void *__src;
  mz_uint n_00;
  mz_bool mVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  int *piVar6;
  bool bVar7;
  ulong local_248;
  ulong local_240;
  size_t local_238;
  ulong local_230;
  mz_uint8 *pSrc_central_header;
  void *pBuf;
  mz_zip_internal_state *pState;
  size_t orig_central_dir_size;
  mz_uint8 central_header [46];
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  mz_uint64 local_190;
  mz_uint64 cur_dst_file_ofs;
  mz_uint64 cur_src_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint64 comp_bytes_remaining;
  mz_uint num_alignment_padding_bytes;
  mz_uint bit_flags;
  mz_uint n;
  mz_uint file_index_local;
  mz_zip_archive *pSource_zip_local;
  mz_zip_archive *pZip_local;
  mz_zip_archive *local_148;
  void *local_140;
  size_t local_138;
  size_t orig_size_2;
  mz_uint *local_128;
  mz_zip_array *local_120;
  mz_zip_archive *local_118;
  uint local_10c;
  size_t local_108;
  size_t orig_size_1;
  void *local_f8;
  mz_zip_internal_state *local_f0;
  mz_zip_archive *local_e8;
  uint local_dc;
  size_t local_d8;
  size_t orig_size;
  size_t *local_c8;
  mz_zip_internal_state *local_c0;
  mz_zip_archive *local_b8;
  uint local_b0;
  undefined4 local_ac;
  size_t local_a8;
  mz_zip_internal_state *local_a0;
  mz_zip_archive *local_98;
  int local_90;
  undefined4 local_8c;
  size_t local_88;
  mz_zip_internal_state *local_80;
  mz_zip_archive *local_78;
  int local_70;
  undefined4 local_6c;
  ulong local_68;
  mz_zip_array *local_60;
  mz_zip_archive *local_58;
  int local_50;
  undefined4 local_4c;
  size_t local_48;
  mz_zip_internal_state *local_40;
  mz_zip_archive *local_38;
  undefined4 local_2c;
  size_t local_28;
  mz_zip_internal_state *local_20;
  mz_zip_archive *local_18;
  
  if (((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
     (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    pZip_local._0_4_ = 0;
  }
  else {
    if (((pSource_zip == (mz_zip_archive *)0x0) ||
        (pSource_zip->m_pState == (mz_zip_internal_state *)0x0)) ||
       ((pSource_zip->m_total_files <= file_index ||
        (pSource_zip->m_zip_mode != MZ_ZIP_MODE_READING)))) {
      local_140 = (void *)0x0;
    }
    else {
      local_140 = (void *)((long)(pSource_zip->m_pState->m_central_dir).m_p +
                          (ulong)*(uint *)((long)(pSource_zip->m_pState->m_central_dir_offsets).m_p
                                          + (ulong)file_index * 4));
    }
    __src = local_140;
    if (local_140 == (void *)0x0) {
      pZip_local._0_4_ = 0;
    }
    else {
      pArray = pZip->m_pState;
      bit_flags = file_index;
      _n = pSource_zip;
      pSource_zip_local = pZip;
      pZip_local._4_4_ = file_index;
      local_148 = pSource_zip;
      n_00 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
      if ((pSource_zip_local->m_total_files == 0xffff) ||
         (0xffffffff < pSource_zip_local->m_archive_size + (ulong)n_00 + 0x4c)) {
        pZip_local._0_4_ = 0;
      }
      else {
        uVar1 = *(uint *)((long)__src + 0x2a);
        cur_file_ofs = pSource_zip_local->m_archive_size;
        sVar4 = (*_n->m_pRead)(_n->m_pIO_opaque,(ulong)uVar1,&pLocal_header,0x1e);
        if (sVar4 == 0x1e) {
          if ((int)pLocal_header == 0x4034b50) {
            cur_dst_file_ofs = (ulong)uVar1 + 0x1e;
            mVar2 = mz_zip_writer_write_zeros(pSource_zip_local,cur_file_ofs,n_00);
            if (mVar2 == 0) {
              pZip_local._0_4_ = 0;
            }
            else {
              uVar5 = n_00 + cur_file_ofs;
              if ((pSource_zip_local->m_file_offset_alignment != 0) &&
                 ((uVar5 & pSource_zip_local->m_file_offset_alignment - 1) != 0)) {
                __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/luazip/miniz.c"
                              ,0x1212,
                              "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                             );
              }
              sVar4 = (*pSource_zip_local->m_pWrite)
                                (pSource_zip_local->m_pIO_opaque,uVar5,&pLocal_header,0x1e);
              if (sVar4 == 0x1e) {
                local_190 = uVar5 + 0x1e;
                num_alignment_padding_bytes =
                     (uint)local_header_u32[4]._2_2_ + (uint)(ushort)local_header_u32[5];
                local_dir_header_ofs =
                     (mz_uint64)(num_alignment_padding_bytes + *(int *)((long)__src + 0x14));
                local_230 = local_dir_header_ofs;
                if (0x10000 < local_dir_header_ofs) {
                  local_230 = 0x10000;
                }
                if (local_230 < 0x10) {
                  local_238 = 0x10;
                }
                else {
                  local_240 = local_dir_header_ofs;
                  if (0x10000 < local_dir_header_ofs) {
                    local_240 = 0x10000;
                  }
                  local_238 = local_240;
                }
                piVar6 = (int *)(*pSource_zip_local->m_pAlloc)
                                          (pSource_zip_local->m_pAlloc_opaque,1,local_238);
                if (piVar6 == (int *)0x0) {
                  pZip_local._0_4_ = 0;
                }
                else {
                  for (; local_dir_header_ofs != 0;
                      local_dir_header_ofs = local_dir_header_ofs - num_alignment_padding_bytes) {
                    if (local_dir_header_ofs < 0x10001) {
                      local_248 = local_dir_header_ofs;
                    }
                    else {
                      local_248 = 0x10000;
                    }
                    num_alignment_padding_bytes = (mz_uint)local_248;
                    sVar4 = (*_n->m_pRead)(_n->m_pIO_opaque,cur_dst_file_ofs,piVar6,
                                           local_248 & 0xffffffff);
                    if (sVar4 != num_alignment_padding_bytes) {
                      (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar6);
                      return 0;
                    }
                    cur_dst_file_ofs = num_alignment_padding_bytes + cur_dst_file_ofs;
                    sVar4 = (*pSource_zip_local->m_pWrite)
                                      (pSource_zip_local->m_pIO_opaque,local_190,piVar6,
                                       (size_t)num_alignment_padding_bytes);
                    if (sVar4 != num_alignment_padding_bytes) {
                      (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar6);
                      return 0;
                    }
                    local_190 = num_alignment_padding_bytes + local_190;
                  }
                  if ((pLocal_header._6_2_ & 8) != 0) {
                    sVar4 = (*_n->m_pRead)(_n->m_pIO_opaque,cur_dst_file_ofs,piVar6,0x10);
                    if (sVar4 != 0x10) {
                      (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar6);
                      return 0;
                    }
                    iVar3 = 3;
                    if (*piVar6 == 0x8074b50) {
                      iVar3 = 4;
                    }
                    num_alignment_padding_bytes = iVar3 << 2;
                    sVar4 = (*pSource_zip_local->m_pWrite)
                                      (pSource_zip_local->m_pIO_opaque,local_190,piVar6,
                                       (size_t)num_alignment_padding_bytes);
                    if (sVar4 != num_alignment_padding_bytes) {
                      (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar6);
                      return 0;
                    }
                    local_190 = num_alignment_padding_bytes + local_190;
                  }
                  (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar6);
                  if (local_190 < 0x100000000) {
                    min_new_capacity = (pArray->m_central_dir).m_size;
                    memcpy(&orig_central_dir_size,__src,0x2e);
                    mz_write_le32(central_header + 0x22,(mz_uint32)uVar5);
                    local_c8 = &orig_central_dir_size;
                    local_b8 = pSource_zip_local;
                    orig_size = 0x2e;
                    local_d8 = (pArray->m_central_dir).m_size;
                    local_a8 = local_d8 + 0x2e;
                    local_98 = pSource_zip_local;
                    local_ac = 1;
                    local_c0 = pArray;
                    local_a0 = pArray;
                    if (((pArray->m_central_dir).m_capacity < local_a8) &&
                       (mVar2 = mz_zip_array_ensure_capacity
                                          (pSource_zip_local,&pArray->m_central_dir,local_a8,1),
                       mVar2 == 0)) {
                      local_90 = 0;
                    }
                    else {
                      (local_a0->m_central_dir).m_size = local_a8;
                      local_90 = 1;
                    }
                    bVar7 = local_90 != 0;
                    if (bVar7) {
                      memcpy((void *)((long)(local_c0->m_central_dir).m_p +
                                     local_d8 * (local_c0->m_central_dir).m_element_size),local_c8,
                             orig_size * (local_c0->m_central_dir).m_element_size);
                    }
                    local_b0 = (uint)bVar7;
                    if (local_b0 == 0) {
                      pZip_local._0_4_ = 0;
                    }
                    else {
                      num_alignment_padding_bytes =
                           (uint)*(ushort *)((long)__src + 0x1c) +
                           (uint)*(ushort *)((long)__src + 0x1e) +
                           (uint)*(ushort *)((long)__src + 0x20);
                      local_f8 = (void *)((long)__src + 0x2e);
                      orig_size_1 = (size_t)num_alignment_padding_bytes;
                      local_e8 = pSource_zip_local;
                      local_108 = (pArray->m_central_dir).m_size;
                      local_88 = local_108 + orig_size_1;
                      local_78 = pSource_zip_local;
                      local_8c = 1;
                      local_f0 = pArray;
                      local_80 = pArray;
                      if (((pArray->m_central_dir).m_capacity < local_88) &&
                         (mVar2 = mz_zip_array_ensure_capacity
                                            (pSource_zip_local,&pArray->m_central_dir,local_88,1),
                         mVar2 == 0)) {
                        local_70 = 0;
                      }
                      else {
                        (local_80->m_central_dir).m_size = local_88;
                        local_70 = 1;
                      }
                      bVar7 = local_70 != 0;
                      if (bVar7) {
                        memcpy((void *)((long)(local_f0->m_central_dir).m_p +
                                       local_108 * (local_f0->m_central_dir).m_element_size),
                               local_f8,orig_size_1 * (local_f0->m_central_dir).m_element_size);
                      }
                      local_dc = (uint)bVar7;
                      if (local_dc == 0) {
                        local_18 = pSource_zip_local;
                        local_2c = 0;
                        local_28 = min_new_capacity;
                        local_20 = pArray;
                        if ((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
                           (mVar2 = mz_zip_array_ensure_capacity
                                              (pSource_zip_local,&pArray->m_central_dir,
                                               min_new_capacity,0), mVar2 != 0)) {
                          (local_20->m_central_dir).m_size = local_28;
                        }
                        pZip_local._0_4_ = 0;
                      }
                      else if ((pArray->m_central_dir).m_size < 0x100000000) {
                        num_alignment_padding_bytes = (mz_uint)min_new_capacity;
                        local_120 = &pArray->m_central_dir_offsets;
                        local_118 = pSource_zip_local;
                        local_128 = &num_alignment_padding_bytes;
                        orig_size_2 = 1;
                        local_138 = (pArray->m_central_dir_offsets).m_size;
                        local_68 = local_138 + 1;
                        local_58 = pSource_zip_local;
                        local_6c = 1;
                        local_60 = local_120;
                        if (((pArray->m_central_dir_offsets).m_capacity < local_68) &&
                           (mVar2 = mz_zip_array_ensure_capacity
                                              (pSource_zip_local,local_120,local_68,1), mVar2 == 0))
                        {
                          local_50 = 0;
                        }
                        else {
                          local_60->m_size = local_68;
                          local_50 = 1;
                        }
                        bVar7 = local_50 != 0;
                        if (bVar7) {
                          memcpy((void *)((long)local_120->m_p +
                                         local_138 * local_120->m_element_size),local_128,
                                 orig_size_2 * local_120->m_element_size);
                        }
                        local_10c = (uint)bVar7;
                        if (local_10c == 0) {
                          local_38 = pSource_zip_local;
                          local_4c = 0;
                          local_48 = min_new_capacity;
                          local_40 = pArray;
                          if ((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,&pArray->m_central_dir,
                                                 min_new_capacity,0), mVar2 != 0)) {
                            (local_40->m_central_dir).m_size = local_48;
                          }
                          pZip_local._0_4_ = 0;
                        }
                        else {
                          pSource_zip_local->m_total_files = pSource_zip_local->m_total_files + 1;
                          pSource_zip_local->m_archive_size = local_190;
                          pZip_local._0_4_ = 1;
                        }
                      }
                      else {
                        pZip_local._0_4_ = 0;
                      }
                    }
                  }
                  else {
                    pZip_local._0_4_ = 0;
                  }
                }
              }
              else {
                pZip_local._0_4_ = 0;
              }
            }
          }
          else {
            pZip_local._0_4_ = 0;
          }
        }
        else {
          pZip_local._0_4_ = 0;
        }
      }
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32 *pSrc_descriptor = (const mz_uint32 *)((const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}